

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_ref_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks,BOOL withchecks,
               BOOL emptyfail)

{
  sljit_compiler *compiler_00;
  sljit_jump *psVar1;
  sljit_jump *psVar2;
  sljit_label *psVar3;
  sljit_jump *psVar4;
  bool bVar5;
  jump_list **local_a8;
  jump_list **local_78;
  sljit_jump *nopartial;
  sljit_jump *partial;
  sljit_jump *jump;
  int offset;
  BOOL ref;
  sljit_compiler *compiler;
  BOOL emptyfail_local;
  BOOL withchecks_local;
  jump_list **backtracks_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  bVar5 = true;
  if (*cc != 0x71) {
    bVar5 = *cc == 0x72;
  }
  jump._0_4_ = 0;
  partial = (sljit_jump *)0x0;
  if (bVar5) {
    jump._0_4_ = (uint)cc[1] << 1;
    sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start + (long)(int)jump * 8);
    if ((withchecks != 0) && (common->unset_backref == 0)) {
      psVar1 = sljit_emit_cmp(compiler_00,0,1,0,0x8e,(long)common->ovector_start + 8);
      add_jump(compiler_00,backtracks,psVar1);
    }
  }
  else {
    sljit_emit_op1(compiler_00,0x20,1,0,0x84,0);
  }
  if (bVar5) {
    sljit_emit_op2(compiler_00,0x262,4,0,0x8e,
                   (long)common->ovector_start + (long)((int)jump + 1) * 8,1,0);
  }
  else {
    sljit_emit_op2(compiler_00,0x262,4,0,0x84,8,1,0);
  }
  if (withchecks != 0) {
    partial = sljit_emit_jump(compiler_00,0);
  }
  sljit_emit_op2(compiler_00,0x60,2,0,2,0,4,0);
  psVar1 = sljit_emit_cmp(compiler_00,4,2,0,0xd,0);
  if (common->mode == 1) {
    add_jump(compiler_00,backtracks,psVar1);
  }
  if (*cc == 0x71) {
    local_78 = &common->casefulcmp;
  }
  else {
    local_78 = &common->caselesscmp;
  }
  psVar2 = sljit_emit_jump(compiler_00,0x19);
  add_jump(compiler_00,local_78,psVar2);
  psVar2 = sljit_emit_cmp(compiler_00,1,4,0,0x40,0);
  add_jump(compiler_00,backtracks,psVar2);
  if (common->mode != 1) {
    psVar2 = sljit_emit_jump(compiler_00,0x18);
    psVar3 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar1,psVar3);
    sljit_emit_op2(compiler_00,0x62,4,0,4,0,2,0);
    sljit_emit_op2(compiler_00,0x60,4,0,4,0,0xd,0);
    psVar1 = sljit_emit_cmp(compiler_00,0,4,0,0x40,0);
    sljit_emit_op1(compiler_00,0x20,2,0,0xd,0);
    if (*cc == 0x71) {
      local_a8 = &common->casefulcmp;
    }
    else {
      local_a8 = &common->caselesscmp;
    }
    psVar4 = sljit_emit_jump(compiler_00,0x19);
    add_jump(compiler_00,local_a8,psVar4);
    psVar4 = sljit_emit_cmp(compiler_00,1,4,0,0x40,0);
    add_jump(compiler_00,backtracks,psVar4);
    psVar3 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar1,psVar3);
    check_partial(common,0);
    psVar1 = sljit_emit_jump(compiler_00,0x18);
    add_jump(compiler_00,backtracks,psVar1);
    psVar3 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar2,psVar3);
  }
  if (partial != (sljit_jump *)0x0) {
    if (emptyfail == 0) {
      psVar3 = sljit_emit_label(compiler_00);
      sljit_set_label(partial,psVar3);
    }
    else {
      add_jump(compiler_00,backtracks,partial);
    }
  }
  return;
}

Assistant:

static void compile_ref_matchingpath(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks, BOOL withchecks, BOOL emptyfail)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
int offset = 0;
struct sljit_jump *jump = NULL;
struct sljit_jump *partial;
struct sljit_jump *nopartial;

if (ref)
  {
  offset = GET2(cc, 1) << 1;
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  /* OVECTOR(1) contains the "string begin - 1" constant. */
  if (withchecks && !common->unset_backref)
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
  }
else
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);

#if defined SUPPORT_UNICODE
if (common->utf && *cc == OP_REFI)
  {
  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  if (ref)
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));

  if (withchecks)
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_R2, 0);
  /* No free saved registers so save data on stack. */

  OP1(SLJIT_MOV, SLJIT_R3, 0, STR_END, 0);
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW) | SLJIT_ARG3(SW) | SLJIT_ARG4(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_utf_caselesscmp));
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, CMP(SLJIT_LESS_EQUAL, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1));
  else
    {
    OP2(SLJIT_SUB | SLJIT_SET_Z | SLJIT_SET_LESS, SLJIT_UNUSED, 0, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1);

    add_jump(compiler, backtracks, JUMP(SLJIT_LESS));

    nopartial = JUMP(SLJIT_NOT_EQUAL);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }
else
#endif /* SUPPORT_UNICODE */
  {
  if (ref)
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), TMP1, 0);
  else
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw), TMP1, 0);

  if (withchecks)
    jump = JUMP(SLJIT_ZERO);

  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP2, 0);
  partial = CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0);
  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, partial);

  add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));

  if (common->mode != PCRE2_JIT_COMPLETE)
    {
    nopartial = JUMP(SLJIT_JUMP);
    JUMPHERE(partial);
    /* TMP2 -= STR_END - STR_PTR */
    OP2(SLJIT_SUB, TMP2, 0, TMP2, 0, STR_PTR, 0);
    OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, STR_END, 0);
    partial = CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, 0);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));
    JUMPHERE(partial);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }

if (jump != NULL)
  {
  if (emptyfail)
    add_jump(compiler, backtracks, jump);
  else
    JUMPHERE(jump);
  }
}